

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::RegrSState,double,double,duckdb::RegrSYYOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,RegrSState **states,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *ssel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  AggregateBinaryInput *idata;
  AggregateInputData *in_RSI;
  RegrSState *in_R8;
  SelectionVector *in_R9;
  idx_t sidx_1;
  idx_t i_1;
  idx_t sidx;
  idx_t i;
  AggregateBinaryInput input;
  AggregateBinaryInput *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  RegrSState *pRVar2;
  double *in_stack_ffffffffffffff98;
  RegrSState *in_stack_ffffffffffffffa0;
  AggregateBinaryInput local_58;
  SelectionVector *local_30;
  RegrSState *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  AggregateBinaryInput::AggregateBinaryInput
            (&local_58,in_RSI,(ValidityMask *)i,(ValidityMask *)input.input);
  bVar1 = RegrBaseOperation::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)i), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1)))) {
    for (pRVar2 = (RegrSState *)0x0; pRVar2 < local_28;
        pRVar2 = (RegrSState *)((long)&pRVar2->count + 1)) {
      local_58.lidx = SelectionVector::get_index(local_30,(idx_t)pRVar2);
      local_58.ridx = SelectionVector::get_index((SelectionVector *)i_1,(idx_t)pRVar2);
      idata = (AggregateBinaryInput *)
              SelectionVector::get_index((SelectionVector *)sidx,(idx_t)pRVar2);
      RegrSYYOperation::Operation<double,double,duckdb::RegrSState,duckdb::RegrSYYOperation>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(double *)pRVar2,idata);
    }
  }
  else {
    for (pRVar2 = (RegrSState *)0x0; pRVar2 < local_28;
        pRVar2 = (RegrSState *)((long)&pRVar2->count + 1)) {
      local_58.lidx = SelectionVector::get_index(local_30,(idx_t)pRVar2);
      local_58.ridx = SelectionVector::get_index((SelectionVector *)i_1,(idx_t)pRVar2);
      this = (TemplatedValidityMask<unsigned_long> *)
             SelectionVector::get_index((SelectionVector *)sidx,(idx_t)pRVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (this,(idx_t)in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (this,(idx_t)in_stack_ffffffffffffff90), bVar1)) {
        RegrSYYOperation::Operation<double,double,duckdb::RegrSState,duckdb::RegrSYYOperation>
                  (pRVar2,(double *)this,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}